

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_cursor.cxx
# Opt level: O3

void __thiscall Fl_Window::cursor(Fl_Window *this,Fl_RGB_Image *image,int hotx,int hoty)

{
  int iVar1;
  Fl_Window *pFVar2;
  Fl_Window *this_00;
  
  do {
    this_00 = this;
    pFVar2 = Fl_Widget::window((Fl_Widget *)this_00);
    if (pFVar2 == (Fl_Window *)0x0) break;
    do {
      this = pFVar2;
      pFVar2 = Fl_Widget::window((Fl_Widget *)this);
    } while (pFVar2 != (Fl_Window *)0x0);
  } while (this != this_00);
  if (this_00->i != (Fl_X *)0x0) {
    iVar1 = Fl_X::set_cursor(this_00->i,image,hotx,hoty);
    if (iVar1 == 0) {
      cursor(this_00,FL_CURSOR_DEFAULT);
      return;
    }
  }
  return;
}

Assistant:

void Fl_Window::cursor(const Fl_RGB_Image *image, int hotx, int hoty) {
  int ret;

  // the cursor must be set for the top level window, not for subwindows
  Fl_Window *w = window(), *toplevel = this;

  while (w) {
    toplevel = w;
    w = w->window();
  }

  if (toplevel != this) {
    toplevel->cursor(image, hotx, hoty);
    return;
  }

  if (!i)
    return;

  ret = i->set_cursor(image, hotx, hoty);
  if (ret)
    return;

  cursor(FL_CURSOR_DEFAULT);
}